

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::getSymbolId
          (TGlslangToSpvTraverser *this,TIntermSymbol *symbol)

{
  Builder *pBVar1;
  Module *this_00;
  mapped_type mVar2;
  Instruction *pIVar3;
  TIntermediate *pTVar4;
  Decoration *pDVar5;
  pointer pDVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  BuiltIn num;
  Id IVar10;
  Id IVar11;
  StorageClass SVar12;
  TLayoutPacking explicitLayout;
  Decoration DVar13;
  undefined4 extraout_var;
  iterator iVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  iterator iVar15;
  undefined4 extraout_var_03;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  undefined4 extraout_var_04;
  TType *type;
  TGlslangToSpvTraverser *this_01;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar18;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined8 *puVar19;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  TQualifier *pTVar20;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  ulong uVar21;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  long *plVar22;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  char *name;
  ulong uVar23;
  char *pcVar24;
  _Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  uint uVar25;
  byte bVar26;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> topLevelDecorations;
  TQualifier typeQualifier;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> local_c8;
  Id local_a8;
  Id local_a4;
  BuiltIn local_a0;
  BuiltIn local_9c;
  undefined1 local_98 [8];
  TPoolAllocator *pTStack_90;
  pointer local_88;
  ulong local_40;
  _Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  
  bVar26 = 0;
  this_02 = (_Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)&this->symbolValues;
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  local_98 = (undefined1  [8])CONCAT44(extraout_var,iVar9);
  iVar14 = std::
           _Hashtable<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find((_Hashtable<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)this_02,(key_type_conflict2 *)local_98);
  if (iVar14.super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    return *(Id *)((long)iVar14.
                         super__Node_iterator_base<std::pair<const_long_long,_unsigned_int>,_false>.
                         _M_cur + 0x10);
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  local_a8 = 0;
  num = TranslateBuiltInDecoration
                  (this,*(uint *)(CONCAT44(extraout_var_00,iVar9) + 8) >> 7 & 0x1ff,false);
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar25 = *(uint *)(CONCAT44(extraout_var_01,iVar9) + 8) >> 7 & 0x1ff;
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  if (uVar25 - 0xb < 5) {
    cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar9) + 0xd8))
                      ((long *)CONCAT44(extraout_var_02,iVar9));
    IVar10 = 0;
    if (cVar7 == '\0') {
      pBVar1 = &this->builder;
      IVar10 = spv::Builder::makeIntegerType(pBVar1,0x20,false);
      local_a8 = spv::Builder::makeVectorType(pBVar1,IVar10,4);
      IVar10 = spv::Builder::makeIntegerType(pBVar1,0x40,false);
    }
  }
  else if ((uVar25 == 0x6d) || (IVar10 = 0, uVar25 == 0x6f)) {
    pBVar1 = &this->builder;
    IVar10 = spv::Builder::makeFloatType(pBVar1,0x20);
    local_a8 = spv::Builder::makeMatrixType(pBVar1,IVar10,4,3);
    IVar10 = spv::Builder::makeFloatType(pBVar1,0x20);
    IVar10 = spv::Builder::makeMatrixType(pBVar1,IVar10,3,4);
  }
  if ((num & ~BuiltInPointSize) == BuiltInObjectToWorldKHR) {
    local_98._0_4_ = num;
    iVar15 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->builtInVariableIds)._M_h,(key_type *)local_98);
    if (iVar15.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        != (__node_type *)0x0) {
      mVar2 = *(mapped_type *)
               ((long)iVar15.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 0xc);
      local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_c8.
                             super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,mVar2);
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
      local_98 = (undefined1  [8])CONCAT44(extraout_var_03,iVar9);
      pmVar16 = std::__detail::
                _Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](this_02,(key_type *)local_98);
      *pmVar16 = mVar2;
      if (IVar10 != 0) {
        pmVar17 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->forceType,(key_type *)&local_c8);
        *pmVar17 = IVar10;
      }
      goto LAB_003abfb8;
    }
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar9 == 0x16) {
    return 0;
  }
  local_9c = num & ~BuiltInPointSize;
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  uVar21 = *(ulong *)(CONCAT44(extraout_var_04,iVar9) + 8);
  if (((uVar21 & 0x10000007f) == 2 || (uVar21 >> 0x20 & 1) != 0) &&
     (IVar11 = createSpvConstant(this,&symbol->super_TIntermTyped), IVar11 != 0)) goto LAB_003ab51b;
  local_38 = this_02;
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  type = (TType *)CONCAT44(extraout_var_05,iVar9);
  SVar12 = TranslateStorageClass(this,type);
  local_40 = (ulong)SVar12;
  if (local_a8 == 0) {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    this_01 = (TGlslangToSpvTraverser *)CONCAT44(extraout_var_06,iVar9);
    explicitLayout = getExplicitLayout(this_01,type);
    iVar9 = (*(this_01->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(this_01);
    SVar12 = (StorageClass)local_40;
    local_a8 = convertGlslangToSpvType
                         (this,(TType *)this_01,explicitLayout,
                          (TQualifier *)CONCAT44(extraout_var_07,iVar9),false,false);
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar9) + 400))
                    ((long *)CONCAT44(extraout_var_08,iVar9),3);
  if (cVar7 == '\0') {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    plVar22 = (long *)CONCAT44(extraout_var_09,iVar9);
    cVar7 = (**(code **)(*plVar22 + 400))(plVar22,6);
    if ((cVar7 != '\0') || (cVar7 = (**(code **)(*plVar22 + 400))(plVar22,7), cVar7 != '\0'))
    goto LAB_003ab09c;
    goto LAB_003ab24b;
  }
LAB_003ab09c:
  switch(SVar12) {
  case Input:
  case Output:
    if ((this->builder).spvVersion < 0x10300) {
      spv::Builder::addExtension(&this->builder,"SPV_KHR_16bit_storage");
    }
    local_98._0_4_ = 0x1154;
    break;
  case StorageClassUniform:
    if ((this->builder).spvVersion < 0x10300) {
      spv::Builder::addExtension(&this->builder,"SPV_KHR_16bit_storage");
    }
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_10,iVar9));
    if ((*(uint *)(lVar18 + 8) & 0x7f) == 6) {
      local_98._0_4_ = 0x1151;
    }
    else {
      local_98._0_4_ = 0x1152;
    }
    break;
  case StorageClassWorkgroup:
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar9) + 0x38))
                      ((long *)CONCAT44(extraout_var_11,iVar9));
    if (iVar9 != 0x10) goto switchD_003ab0b2_caseD_5;
    local_98._0_4_ = 0x114e;
    break;
  case CrossWorkgroup:
  case Private:
  case Function:
  case Generic:
  case AtomicCounter:
  case Image:
    goto switchD_003ab0b2_caseD_5;
  case PushConstant:
    if ((this->builder).spvVersion < 0x10300) {
      spv::Builder::addExtension(&this->builder,"SPV_KHR_16bit_storage");
    }
    local_98._0_4_ = 0x1153;
    break;
  case StorageBuffer:
switchD_003ab0b2_caseD_c:
    if ((this->builder).spvVersion < 0x10300) {
      spv::Builder::addExtension(&this->builder,"SPV_KHR_16bit_storage");
    }
    local_98._0_4_ = 0x1151;
    break;
  default:
    if (SVar12 == PhysicalStorageBuffer) goto switchD_003ab0b2_caseD_c;
switchD_003ab0b2_caseD_5:
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 400))
                      ((long *)CONCAT44(extraout_var_12,iVar9),3);
    if (cVar7 != '\0') {
      local_98._0_4_ = 9;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)local_98);
    }
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    plVar22 = (long *)CONCAT44(extraout_var_13,iVar9);
    cVar7 = (**(code **)(*plVar22 + 400))(plVar22,6);
    if ((cVar7 != '\0') || (cVar7 = (**(code **)(*plVar22 + 400))(plVar22,7), cVar7 != '\0')) {
      local_98._0_4_ = 0x16;
      break;
    }
    goto LAB_003ab24b;
  }
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&(this->builder).capabilities,(Capability *)local_98);
LAB_003ab24b:
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  plVar22 = (long *)CONCAT44(extraout_var_14,iVar9);
  cVar7 = (**(code **)(*plVar22 + 400))(plVar22,4);
  if ((cVar7 != '\0') || (cVar7 = (**(code **)(*plVar22 + 400))(plVar22,5), cVar7 != '\0')) {
    if ((int)SVar12 < 9) {
      if (SVar12 == StorageClassUniform) {
        if ((this->builder).spvVersion < 0x10500) {
          spv::Builder::addExtension(&this->builder,"SPV_KHR_8bit_storage");
        }
        local_98._0_4_ = 0x1161;
      }
      else {
        if (SVar12 == StorageClassWorkgroup) {
          iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar9) + 0x38))
                            ((long *)CONCAT44(extraout_var_15,iVar9));
          if (iVar9 == 0x10) {
            local_98._0_4_ = 0x114d;
            goto LAB_003ab352;
          }
        }
LAB_003ab2f5:
        local_98._0_4_ = 0x27;
      }
    }
    else if (SVar12 == StorageBuffer) {
      if ((this->builder).spvVersion < 0x10500) {
        spv::Builder::addExtension(&this->builder,"SPV_KHR_8bit_storage");
      }
      local_98._0_4_ = 0x1160;
    }
    else {
      if (SVar12 != PushConstant) goto LAB_003ab2f5;
      if ((this->builder).spvVersion < 0x10500) {
        spv::Builder::addExtension(&this->builder,"SPV_KHR_8bit_storage");
      }
      local_98._0_4_ = 0x1162;
    }
LAB_003ab352:
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)local_98);
  }
  local_a0 = num;
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
  pcVar24 = *(char **)(CONCAT44(extraout_var_16,iVar9) + 8);
  local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)glslang::GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_98,
             pcVar24,(pool_allocator<char> *)&local_c8);
  IVar11 = 0;
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_98,0,5,"anon@");
  name = "";
  if (iVar9 != 0) {
    name = pcVar24;
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar9) + 0x58))
                     ((long *)CONCAT44(extraout_var_17,iVar9));
  local_a4 = IVar10;
  if (((*(uint *)(lVar18 + 8) & 0x7f) == 5) &&
     ((symbol->constArray).unionArray != (TConstUnionVector *)0x0)) {
    local_98 = (undefined1  [8])((ulong)local_98 & 0xffffffff00000000);
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    IVar11 = createSpvConstantFromConstUnionArray
                       (this,(TType *)CONCAT44(extraout_var_18,iVar9),&symbol->constArray,
                        (int *)local_98,false);
  }
  else {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_19,iVar9));
    if ((*(byte *)(lVar18 + 0xf) & 4) != 0) {
      IVar11 = spv::Builder::makeNullConstant(&this->builder,local_a8);
    }
  }
  IVar11 = spv::Builder::createVariable
                     (&this->builder,DecorationMax,(StorageClass)local_40,local_a8,name,IVar11,false
                     );
  local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_start = (Decoration *)0x0;
  local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_finish = (Decoration *)0x0;
  local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  puVar19 = (undefined8 *)
            (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar9) + 0x58))
                      ((long *)CONCAT44(extraout_var_20,iVar9));
  pTVar20 = (TQualifier *)local_98;
  for (lVar18 = 10; lVar18 != 0; lVar18 = lVar18 + -1) {
    pTVar20->semanticName = (char *)*puVar19;
    puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
    pTVar20 = (TQualifier *)((long)pTVar20 + (ulong)bVar26 * -0x10 + 8);
  }
  TranslateMemoryDecoration
            ((TQualifier *)local_98,&local_c8,this->glslangIntermediate->useVulkanMemoryModel);
  pDVar6 = local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar10 = local_a4;
  num = local_a0;
  for (pDVar5 = local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                _M_impl.super__Vector_impl_data._M_start; local_a4 = IVar10, local_a0 = num,
      pDVar5 != pDVar6; pDVar5 = pDVar5 + 1) {
    spv::Builder::addDecoration(&this->builder,IVar11,*pDVar5,-1);
    IVar10 = local_a4;
    num = local_a0;
  }
  if (local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
      super__Vector_impl_data._M_start != (Decoration *)0x0) {
    operator_delete(local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  this_02 = local_38;
LAB_003ab51b:
  local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_c8.
                         super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,IVar11);
  if (local_9c == BuiltInObjectToWorldKHR) {
    local_98._4_4_ = IVar11;
    local_98._0_4_ = num;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->builtInVariableIds);
    IVar11 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(symbol);
  local_98 = (undefined1  [8])CONCAT44(extraout_var_21,iVar9);
  pmVar16 = std::__detail::
            _Map_base<long_long,_std::pair<const_long_long,_unsigned_int>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[](this_02,(key_type *)local_98);
  *pmVar16 = IVar11;
  if (IVar10 != 0) {
    pmVar17 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->forceType,(key_type *)&local_c8);
    *pmVar17 = IVar10;
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(symbol);
  if (iVar9 != 0x10) {
    pBVar1 = &this->builder;
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_22,iVar9));
    DVar13 = DecorationMax;
    if ((*(uint *)(lVar18 + 8) >> 0x19 & 7) - 1 < 2) {
      DVar13 = DecorationRelaxedPrecision;
    }
    spv::Builder::addDecoration(pBVar1,IVar10,DVar13,-1);
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_23,iVar9));
    DVar13 = TranslateInterpolationDecoration(this,*(TQualifier **)(lVar18 + 8));
    spv::Builder::addDecoration(pBVar1,IVar10,DVar13,-1);
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_24,iVar9));
    DVar13 = TranslateAuxiliaryStorageDecoration(this,*(TQualifier **)(lVar18 + 8));
    spv::Builder::addDecoration(pBVar1,IVar10,DVar13,-1);
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar20 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar9) + 0x58))
                        ((long *)CONCAT44(extraout_var_25,iVar9));
    addMeshNVDecoration(this,IVar10,-1,pTVar20);
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((*(uint *)(CONCAT44(extraout_var_26,iVar9) + 0x1c) & 0x7000) != 0x4000) {
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar10,Component,
                 *(uint *)(CONCAT44(extraout_var_27,iVar9) + 0x1c) >> 0xc & 7);
    }
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_28,iVar9) + 0x1c) >> 0x30) != -1) {
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar10,DecorationIndex,
                 (uint)*(byte *)(CONCAT44(extraout_var_29,iVar9) + 0x22));
    }
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_30,iVar9));
    if ((~*(ulong *)(lVar18 + 0x24) & 0x7ff0000000000) != 0) {
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_31,iVar9) + 0x58))
                         ((long *)CONCAT44(extraout_var_31,iVar9));
      spv::Builder::addDecoration
                (pBVar1,IVar10,DecorationSpecId,
                 (uint)((ulong)*(undefined8 *)(lVar18 + 0x24) >> 0x28) & 0x7ff);
    }
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if (*(int *)(CONCAT44(extraout_var_32,iVar9) + 0x14) != -1) {
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar10,DecorationOffset,*(int *)(CONCAT44(extraout_var_33,iVar9) + 0x14));
    }
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((~*(uint *)(CONCAT44(extraout_var_34,iVar9) + 0x1c) & 0xfff) != 0) {
    if ((this->glslangIntermediate->language - EShLangRayGen < 6) &&
       ((bVar8 = glslang::TIntermediate::IsRequestedExtension
                           (this->glslangIntermediate,"GL_EXT_ray_tracing"), bVar8 ||
        (bVar8 = glslang::TIntermediate::IsRequestedExtension
                           (this->glslangIntermediate,"GL_NV_shader_invocation_reorder"), bVar8))))
    {
      pIVar3 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [(ulong)local_c8.
                       super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl
                       .super__Vector_impl_data._M_start & 0xffffffff];
      if (pIVar3 == (Instruction *)0x0) {
        IVar10 = 0;
      }
      else {
        IVar10 = pIVar3->typeId;
      }
      this_00 = &(this->builder).module;
      SVar12 = spv::Module::getStorageClass(this_00,IVar10);
      if (SVar12 != RayPayloadKHR) {
        pIVar3 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start
                 [(ulong)local_c8.
                         super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                         _M_impl.super__Vector_impl_data._M_start & 0xffffffff];
        if (pIVar3 == (Instruction *)0x0) {
          IVar10 = 0;
        }
        else {
          IVar10 = pIVar3->typeId;
        }
        SVar12 = spv::Module::getStorageClass(this_00,IVar10);
        if (SVar12 != IncomingRayPayloadKHR) {
          pIVar3 = (this->builder).module.idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(ulong)local_c8.
                           super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                           _M_impl.super__Vector_impl_data._M_start & 0xffffffff];
          if (pIVar3 == (Instruction *)0x0) {
            IVar10 = 0;
          }
          else {
            IVar10 = pIVar3->typeId;
          }
          SVar12 = spv::Module::getStorageClass(this_00,IVar10);
          if (SVar12 != CallableDataKHR) {
            pIVar3 = (this->builder).module.idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(ulong)local_c8.
                             super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                             _M_impl.super__Vector_impl_data._M_start & 0xffffffff];
            if (pIVar3 == (Instruction *)0x0) {
              IVar10 = 0;
            }
            else {
              IVar10 = pIVar3->typeId;
            }
            SVar12 = spv::Module::getStorageClass(this_00,IVar10);
            if (SVar12 != IncomingCallableDataKHR) {
              pIVar3 = (this->builder).module.idToInstruction.
                       super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(ulong)local_c8.
                               super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>
                               ._M_impl.super__Vector_impl_data._M_start & 0xffffffff];
              if (pIVar3 == (Instruction *)0x0) {
                IVar10 = 0;
              }
              else {
                IVar10 = pIVar3->typeId;
              }
              SVar12 = spv::Module::getStorageClass(this_00,IVar10);
              if (SVar12 != HitObjectAttributeNV) goto LAB_003ab8ca;
            }
          }
        }
      }
    }
    else {
LAB_003ab8ca:
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (&this->builder,IVar10,DecorationLocation,
                 *(uint *)(CONCAT44(extraout_var_35,iVar9) + 0x1c) & 0xfff);
    }
  }
  pBVar1 = &this->builder;
  IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
               _M_impl.super__Vector_impl_data._M_start;
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_36,iVar9) + 0x58))
                     ((long *)CONCAT44(extraout_var_36,iVar9));
  DVar13 = DecorationInvariant;
  if ((*(uint *)(lVar18 + 8) >> 0x1c & 1) == 0) {
    DVar13 = DecorationMax;
  }
  spv::Builder::addDecoration(pBVar1,IVar10,DVar13,-1);
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(char *)(CONCAT44(extraout_var_37,iVar9) + 0x23) != -1) &&
     (this->glslangIntermediate->multiStream == true)) {
    local_98._0_4_ = 0x36;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)local_98);
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    spv::Builder::addDecoration
              (pBVar1,IVar10,DecorationStream,
               (uint)*(byte *)(CONCAT44(extraout_var_38,iVar9) + 0x23));
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(uint *)(CONCAT44(extraout_var_39,iVar9) + 0x1c) & 0x3f8000) == 0x1f8000) {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar8 = IsDescriptorResource((TType *)CONCAT44(extraout_var_40,iVar9));
    if (bVar8) {
      uVar25 = 0;
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      goto LAB_003ab9fb;
    }
  }
  else {
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar25 = *(uint *)(CONCAT44(extraout_var_41,iVar9) + 0x1c) >> 0xf & 0x7f;
LAB_003ab9fb:
    spv::Builder::addDecoration(pBVar1,IVar10,DecorationDescriptorSet,uVar25);
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((short)((ulong)*(undefined8 *)(CONCAT44(extraout_var_42,iVar9) + 0x1c) >> 0x20) == -1) {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar8 = IsDescriptorResource((TType *)CONCAT44(extraout_var_43,iVar9));
    if (bVar8) {
      uVar25 = 0;
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      goto LAB_003aba62;
    }
  }
  else {
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar25 = (uint)*(ushort *)(CONCAT44(extraout_var_44,iVar9) + 0x20);
LAB_003aba62:
    spv::Builder::addDecoration(pBVar1,IVar10,Binding,uVar25);
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_45,iVar9) + 0x24) >> 0x20) != -1) {
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    spv::Builder::addDecoration
              (pBVar1,IVar10,DecorationInputAttachmentIndex,
               (uint)*(byte *)(CONCAT44(extraout_var_46,iVar9) + 0x28));
  }
  if (this->glslangIntermediate->xfbMode == true) {
    local_98._0_4_ = 0x35;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)local_98);
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((~*(uint *)(CONCAT44(extraout_var_47,iVar9) + 0x24) & 0xf) != 0) {
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar10,DecorationXfbBuffer,
                 *(uint *)(CONCAT44(extraout_var_48,iVar9) + 0x24) & 0xf);
      pTVar4 = this->glslangIntermediate;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      uVar25 = (pTVar4->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start
               [(uint)*(undefined8 *)(CONCAT44(extraout_var_49,iVar9) + 0x24) & 0xf].stride;
      if (uVar25 != 0x3fff) {
        spv::Builder::addDecoration
                  (pBVar1,(Id)local_c8.
                              super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                              _M_impl.super__Vector_impl_data._M_start,DecorationXfbStride,uVar25);
      }
    }
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if ((~*(uint *)(CONCAT44(extraout_var_50,iVar9) + 0x24) & 0x7ffc0000) != 0) {
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar10,DecorationOffset,
                 *(uint *)(CONCAT44(extraout_var_51,iVar9) + 0x24) >> 0x12 & 0x1fff);
    }
  }
  if ((num != BuiltInMax) &&
     ((num != BuiltInWorkgroupSize || ((this->glslangIntermediate->spvVersion).spv < 0x10600)))) {
    spv::Builder::addDecoration
              (pBVar1,(Id)local_c8.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,BuiltIn,num);
    if ((num == BuiltInHelperInvocation) &&
       ((this->glslangIntermediate->useVulkanMemoryModel == false &&
        (0x105ff < (this->glslangIntermediate->spvVersion).spv)))) {
      spv::Builder::addDecoration
                (pBVar1,(Id)local_c8.
                            super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                            _M_impl.super__Vector_impl_data._M_start,DecorationVolatile,-1);
    }
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  cVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_52,iVar9) + 0x158))
                    ((long *)CONCAT44(extraout_var_52,iVar9));
  if (cVar7 == '\0') {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    uVar25 = *(uint *)(CONCAT44(extraout_var_53,iVar9) + 8);
    if (((uVar25 & 0x7f) < 0x1c) && ((0xe300008U >> (uVar25 & 0x1f) & 1) != 0)) goto LAB_003abc3d;
  }
  else {
LAB_003abc3d:
    local_98 = (undefined1  [8])0x0;
    pTStack_90 = (TPoolAllocator *)0x0;
    local_88 = (pointer)0x0;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar20 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_54,iVar9) + 0x58))
                        ((long *)CONCAT44(extraout_var_54,iVar9));
    TranslateMemoryDecoration
              (pTVar20,(vector<spv::Decoration,_std::allocator<spv::Decoration>_> *)local_98,
               this->glslangIntermediate->useVulkanMemoryModel);
    if ((undefined1  [8])pTStack_90 != local_98) {
      uVar21 = 0;
      uVar23 = 1;
      do {
        spv::Builder::addDecoration
                  (pBVar1,(Id)local_c8.
                              super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                   *(Decoration *)((long)(size_t *)local_98 + uVar21 * 4),-1);
        bVar8 = uVar23 < (ulong)((long)pTStack_90 - (long)local_98 >> 2);
        uVar21 = uVar23;
        uVar23 = (ulong)((int)uVar23 + 1);
      } while (bVar8);
    }
    if (local_98 != (undefined1  [8])0x0) {
      operator_delete((void *)local_98,(long)local_88 - (long)local_98);
    }
  }
  if (num == BuiltInLayer) {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if (*(char *)(CONCAT44(extraout_var_55,iVar9) + 0x30) == '\x01') {
      spv::Builder::addDecoration
                (pBVar1,(Id)local_c8.
                            super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                            _M_impl.super__Vector_impl_data._M_start,DecorationViewportRelativeNV,-1
                );
      local_98._0_4_ = 0x1487;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)local_98);
      spv::Builder::addExtension(pBVar1,"SPV_NV_viewport_array2");
    }
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
    if (*(int *)(CONCAT44(extraout_var_56,iVar9) + 0x34) != -0x800) {
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
      spv::Builder::addDecoration
                (pBVar1,IVar10,DecorationSecondaryViewportRelativeNV,
                 *(int *)(CONCAT44(extraout_var_57,iVar9) + 0x34));
      local_98._0_4_ = 0x148b;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)local_98);
      pcVar24 = "SPV_NV_stereo_view_rendering";
LAB_003abde2:
      spv::Builder::addExtension(pBVar1,pcVar24);
    }
  }
  else if (num == BuiltInSampleMask) {
    bVar8 = this->glslangIntermediate->layoutOverrideCoverage;
    DVar13 = DecorationMax;
    if (bVar8 != false) {
      DVar13 = DecorationOverrideCoverageNV;
    }
    spv::Builder::addDecoration
              (pBVar1,(Id)local_c8.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DVar13,-1);
    if (bVar8 == true) {
      local_98._0_4_ = 0x1481;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,(Capability *)local_98);
      pcVar24 = "SPV_NV_sample_mask_override_coverage";
      goto LAB_003abde2;
    }
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if (*(char *)(CONCAT44(extraout_var_58,iVar9) + 0x2f) == '\x01') {
    spv::Builder::addDecoration
              (pBVar1,(Id)local_c8.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DecorationPassthroughNV,-1);
    local_98._0_4_ = 0x1483;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)local_98);
    spv::Builder::addExtension(pBVar1,"SPV_NV_geometry_shader_passthrough");
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(byte *)(CONCAT44(extraout_var_59,iVar9) + 0xc) & 0x80) != 0) {
    spv::Builder::addDecoration
              (pBVar1,(Id)local_c8.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DecorationPerVertexKHR,-1);
    local_98._0_4_ = 0x14a4;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)local_98);
    spv::Builder::addExtension(pBVar1,"SPV_NV_fragment_shader_barycentric");
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(symbol);
  if ((*(byte *)(CONCAT44(extraout_var_60,iVar9) + 0xd) & 1) != 0) {
    spv::Builder::addDecoration
              (pBVar1,(Id)local_c8.
                          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                          _M_impl.super__Vector_impl_data._M_start,DecorationPerVertexKHR,-1);
    local_98._0_4_ = 0x14a4;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)local_98);
    spv::Builder::addExtension(pBVar1,"SPV_KHR_fragment_shader_barycentric");
  }
  if (this->glslangIntermediate->hlslFunctionality1 == true) {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    plVar22 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_61,iVar9) + 0x58))
                                ((long *)CONCAT44(extraout_var_61,iVar9));
    if (*plVar22 != 0) {
      spv::Builder::addExtension(pBVar1,"SPV_GOOGLE_hlsl_functionality1");
      IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      puVar19 = (undefined8 *)
                (**(code **)(*(long *)CONCAT44(extraout_var_62,iVar9) + 0x58))
                          ((long *)CONCAT44(extraout_var_62,iVar9));
      spv::Builder::addDecoration(pBVar1,IVar10,DecorationHlslSemanticGOOGLE,(char *)*puVar19);
    }
  }
  iVar9 = (*(symbol->super_TIntermTyped).type._vptr_TType[7])(&(symbol->super_TIntermTyped).type);
  if (iVar9 == 0x12) {
    IVar10 = (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_63,iVar9) + 0x58))
                       ((long *)CONCAT44(extraout_var_63,iVar9));
    spv::Builder::addDecoration
              (pBVar1,IVar10,AliasedPointer - ((*(ulong *)(lVar18 + 8) >> 0x2e & 1) != 0),-1);
  }
  iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  lVar18 = (**(code **)(*(long *)CONCAT44(extraout_var_64,iVar9) + 0x58))
                     ((long *)CONCAT44(extraout_var_64,iVar9));
  if (*(long *)(lVar18 + 0x40) != 0) {
    iVar9 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    applySpirvDecorate(this,(TType *)CONCAT44(extraout_var_65,iVar9),
                       (Id)local_c8.
                           super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>.
                           _M_impl.super__Vector_impl_data._M_start,(optional<int>)0x0);
  }
LAB_003abfb8:
  return (Id)local_c8.super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>._M_impl.
             super__Vector_impl_data._M_start;
}

Assistant:

spv::Id TGlslangToSpvTraverser::getSymbolId(const glslang::TIntermSymbol* symbol)
{
    auto iter = symbolValues.find(symbol->getId());
    spv::Id id;
    if (symbolValues.end() != iter) {
        id = iter->second;
        return id;
    }

    // it was not found, create it
    spv::BuiltIn builtIn = TranslateBuiltInDecoration(symbol->getQualifier().builtIn, false);
    auto forcedType = getForcedType(symbol->getQualifier().builtIn, symbol->getType());

    // There are pairs of symbols that map to the same SPIR-V built-in:
    // gl_ObjectToWorldEXT and gl_ObjectToWorld3x4EXT, and gl_WorldToObjectEXT
    // and gl_WorldToObject3x4EXT. SPIR-V forbids having two OpVariables
    // with the same BuiltIn in the same storage class, so we must re-use one.
    const bool mayNeedToReuseBuiltIn =
        builtIn == spv::BuiltInObjectToWorldKHR ||
        builtIn == spv::BuiltInWorldToObjectKHR;

    if (mayNeedToReuseBuiltIn) {
        auto iter = builtInVariableIds.find(uint32_t(builtIn));
        if (builtInVariableIds.end() != iter) {
            id = iter->second;
            symbolValues[symbol->getId()] = id;
            if (forcedType.second != spv::NoType)
                forceType[id] = forcedType.second;
            return id;
        }
    }

    if (symbol->getBasicType() == glslang::EbtFunction) {
        return 0;
    }

    id = createSpvVariable(symbol, forcedType.first);

    if (mayNeedToReuseBuiltIn) {
        builtInVariableIds.insert({uint32_t(builtIn), id});
    }

    symbolValues[symbol->getId()] = id;
    if (forcedType.second != spv::NoType)
        forceType[id] = forcedType.second;

    if (symbol->getBasicType() != glslang::EbtBlock) {
        builder.addDecoration(id, TranslatePrecisionDecoration(symbol->getType()));
        builder.addDecoration(id, TranslateInterpolationDecoration(symbol->getType().getQualifier()));
        builder.addDecoration(id, TranslateAuxiliaryStorageDecoration(symbol->getType().getQualifier()));
        addMeshNVDecoration(id, /*member*/ -1, symbol->getType().getQualifier());
        if (symbol->getQualifier().hasComponent())
            builder.addDecoration(id, spv::DecorationComponent, symbol->getQualifier().layoutComponent);
        if (symbol->getQualifier().hasIndex())
            builder.addDecoration(id, spv::DecorationIndex, symbol->getQualifier().layoutIndex);
        if (symbol->getType().getQualifier().hasSpecConstantId())
            builder.addDecoration(id, spv::DecorationSpecId, symbol->getType().getQualifier().layoutSpecConstantId);
        // atomic counters use this:
        if (symbol->getQualifier().hasOffset())
            builder.addDecoration(id, spv::DecorationOffset, symbol->getQualifier().layoutOffset);
    }

    if (symbol->getQualifier().hasLocation()) {
        if (!(glslangIntermediate->isRayTracingStage() &&
              (glslangIntermediate->IsRequestedExtension(glslang::E_GL_EXT_ray_tracing) ||
               glslangIntermediate->IsRequestedExtension(glslang::E_GL_NV_shader_invocation_reorder))
              && (builder.getStorageClass(id) == spv::StorageClassRayPayloadKHR ||
                  builder.getStorageClass(id) == spv::StorageClassIncomingRayPayloadKHR ||
                  builder.getStorageClass(id) == spv::StorageClassCallableDataKHR ||
                  builder.getStorageClass(id) == spv::StorageClassIncomingCallableDataKHR ||
                  builder.getStorageClass(id) == spv::StorageClassHitObjectAttributeNV))) {
            // Location values are used to link TraceRayKHR/ExecuteCallableKHR/HitObjectGetAttributesNV
            // to corresponding variables but are not valid in SPIRV since they are supported only
            // for Input/Output Storage classes.
            builder.addDecoration(id, spv::DecorationLocation, symbol->getQualifier().layoutLocation);
        }
    }

    builder.addDecoration(id, TranslateInvariantDecoration(symbol->getType().getQualifier()));
    if (symbol->getQualifier().hasStream() && glslangIntermediate->isMultiStream()) {
        builder.addCapability(spv::CapabilityGeometryStreams);
        builder.addDecoration(id, spv::DecorationStream, symbol->getQualifier().layoutStream);
    }
    if (symbol->getQualifier().hasSet())
        builder.addDecoration(id, spv::DecorationDescriptorSet, symbol->getQualifier().layoutSet);
    else if (IsDescriptorResource(symbol->getType())) {
        // default to 0
        builder.addDecoration(id, spv::DecorationDescriptorSet, 0);
    }
    if (symbol->getQualifier().hasBinding())
        builder.addDecoration(id, spv::DecorationBinding, symbol->getQualifier().layoutBinding);
    else if (IsDescriptorResource(symbol->getType())) {
        // default to 0
        builder.addDecoration(id, spv::DecorationBinding, 0);
    }
    if (symbol->getQualifier().hasAttachment())
        builder.addDecoration(id, spv::DecorationInputAttachmentIndex, symbol->getQualifier().layoutAttachment);
    if (glslangIntermediate->getXfbMode()) {
        builder.addCapability(spv::CapabilityTransformFeedback);
        if (symbol->getQualifier().hasXfbBuffer()) {
            builder.addDecoration(id, spv::DecorationXfbBuffer, symbol->getQualifier().layoutXfbBuffer);
            unsigned stride = glslangIntermediate->getXfbStride(symbol->getQualifier().layoutXfbBuffer);
            if (stride != glslang::TQualifier::layoutXfbStrideEnd)
                builder.addDecoration(id, spv::DecorationXfbStride, stride);
        }
        if (symbol->getQualifier().hasXfbOffset())
            builder.addDecoration(id, spv::DecorationOffset, symbol->getQualifier().layoutXfbOffset);
    }

    // add built-in variable decoration
    if (builtIn != spv::BuiltInMax) {
        // WorkgroupSize deprecated in spirv1.6
        if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_6 ||
            builtIn != spv::BuiltInWorkgroupSize)
            builder.addDecoration(id, spv::DecorationBuiltIn, (int)builtIn);
    }

    // Add volatile decoration to HelperInvocation for spirv1.6 and beyond
    if (builtIn == spv::BuiltInHelperInvocation &&
        !glslangIntermediate->usingVulkanMemoryModel() &&
        glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_6) {
        builder.addDecoration(id, spv::DecorationVolatile);
    }

    // Subgroup builtins which have input storage class are volatile for ray tracing stages.
    if (symbol->getType().isImage() || symbol->getQualifier().isPipeInput()) {
        std::vector<spv::Decoration> memory;
        TranslateMemoryDecoration(symbol->getType().getQualifier(), memory,
            glslangIntermediate->usingVulkanMemoryModel());
        for (unsigned int i = 0; i < memory.size(); ++i)
            builder.addDecoration(id, memory[i]);
    }

    if (builtIn == spv::BuiltInSampleMask) {
          spv::Decoration decoration;
          // GL_NV_sample_mask_override_coverage extension
          if (glslangIntermediate->getLayoutOverrideCoverage())
              decoration = (spv::Decoration)spv::DecorationOverrideCoverageNV;
          else
              decoration = (spv::Decoration)spv::DecorationMax;
        builder.addDecoration(id, decoration);
        if (decoration != spv::DecorationMax) {
            builder.addCapability(spv::CapabilitySampleMaskOverrideCoverageNV);
            builder.addExtension(spv::E_SPV_NV_sample_mask_override_coverage);
        }
    }
    else if (builtIn == spv::BuiltInLayer) {
        // SPV_NV_viewport_array2 extension
        if (symbol->getQualifier().layoutViewportRelative) {
            builder.addDecoration(id, (spv::Decoration)spv::DecorationViewportRelativeNV);
            builder.addCapability(spv::CapabilityShaderViewportMaskNV);
            builder.addExtension(spv::E_SPV_NV_viewport_array2);
        }
        if (symbol->getQualifier().layoutSecondaryViewportRelativeOffset != -2048) {
            builder.addDecoration(id, (spv::Decoration)spv::DecorationSecondaryViewportRelativeNV,
                                  symbol->getQualifier().layoutSecondaryViewportRelativeOffset);
            builder.addCapability(spv::CapabilityShaderStereoViewNV);
            builder.addExtension(spv::E_SPV_NV_stereo_view_rendering);
        }
    }

    if (symbol->getQualifier().layoutPassthrough) {
        builder.addDecoration(id, spv::DecorationPassthroughNV);
        builder.addCapability(spv::CapabilityGeometryShaderPassthroughNV);
        builder.addExtension(spv::E_SPV_NV_geometry_shader_passthrough);
    }
    if (symbol->getQualifier().pervertexNV) {
        builder.addDecoration(id, spv::DecorationPerVertexNV);
        builder.addCapability(spv::CapabilityFragmentBarycentricNV);
        builder.addExtension(spv::E_SPV_NV_fragment_shader_barycentric);
    }

    if (symbol->getQualifier().pervertexEXT) {
        builder.addDecoration(id, spv::DecorationPerVertexKHR);
        builder.addCapability(spv::CapabilityFragmentBarycentricKHR);
        builder.addExtension(spv::E_SPV_KHR_fragment_shader_barycentric);
    }

    if (glslangIntermediate->getHlslFunctionality1() && symbol->getType().getQualifier().semanticName != nullptr) {
        builder.addExtension("SPV_GOOGLE_hlsl_functionality1");
        builder.addDecoration(id, (spv::Decoration)spv::DecorationHlslSemanticGOOGLE,
                              symbol->getType().getQualifier().semanticName);
    }

    if (symbol->isReference()) {
        builder.addDecoration(id, symbol->getType().getQualifier().restrict ?
            spv::DecorationRestrictPointerEXT : spv::DecorationAliasedPointerEXT);
    }

    // Add SPIR-V decorations (GL_EXT_spirv_intrinsics)
    if (symbol->getType().getQualifier().hasSpirvDecorate())
        applySpirvDecorate(symbol->getType(), id, {});

    return id;
}